

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

double Gudhi::Persistence_representations::compute_inner_product
                 (Persistence_landscape *l1,Persistence_landscape *l2)

{
  ulong uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  pointer pvVar5;
  pointer pvVar6;
  long lVar7;
  long lVar8;
  size_t level;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  
  pvVar5 = (l1->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(l1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) / 0x18;
  pvVar6 = (l2->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = ((long)(l2->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18;
  if (uVar10 < uVar9) {
    uVar9 = uVar10;
  }
  dVar17 = 0.0;
  uVar10 = 0;
  do {
    if (uVar10 == uVar9) {
      return dVar17;
    }
    lVar7 = *(long *)&pvVar5[uVar10].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl;
    uVar12 = (long)*(pointer *)
                    ((long)&pvVar5[uVar10].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl + 8) - lVar7 >> 4;
    lVar8 = *(long *)&pvVar6[uVar10].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl;
    uVar14 = (long)*(pointer *)
                    ((long)&pvVar6[uVar10].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl + 8) - lVar8 >> 4;
    if (uVar14 * uVar12 != 0) {
      dVar20 = *(double *)(lVar7 + 0x10);
      if (*(double *)(lVar8 + 0x10) <= *(double *)(lVar7 + 0x10)) {
        dVar20 = *(double *)(lVar8 + 0x10);
      }
      uVar16 = 0;
      uVar13 = 0;
      dVar18 = -2147483647.0;
      while ((dVar19 = dVar20, uVar16 < uVar12 - 1 && (uVar13 < uVar14 - 1))) {
        lVar15 = (uVar16 + 1) * 0x10;
        dVar20 = *(double *)(lVar7 + lVar15);
        lVar2 = lVar7 + uVar16 * 0x10;
        dVar22 = *(double *)(lVar7 + uVar16 * 0x10);
        if ((dVar20 != dVar22) || (NAN(dVar20) || NAN(dVar22))) {
          dVar24 = *(double *)(lVar2 + 8);
          dVar21 = (*(double *)(lVar15 + lVar7 + 8) - dVar24) / (dVar20 - dVar22);
        }
        else {
          dVar24 = *(double *)(lVar2 + 8);
          dVar21 = 0.0;
        }
        uVar1 = uVar13 + 1;
        dVar3 = *(double *)(lVar8 + uVar1 * 0x10);
        lVar2 = lVar8 + uVar13 * 0x10;
        dVar4 = *(double *)(lVar8 + uVar13 * 0x10);
        if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
          dVar23 = *(double *)(lVar2 + 8);
          dVar26 = (*(double *)(uVar1 * 0x10 + lVar8 + 8) - dVar23) / (dVar3 - dVar4);
        }
        else {
          dVar23 = *(double *)(lVar2 + 8);
          dVar26 = 0.0;
        }
        dVar24 = dVar24 - dVar22 * dVar21;
        dVar23 = dVar23 - dVar4 * dVar26;
        dVar22 = dVar21 * dVar23 + dVar26 * dVar24;
        dVar23 = dVar23 * dVar24;
        auVar25._0_8_ = dVar21 * dVar26 * dVar18 * dVar18 * dVar18;
        auVar25._8_8_ = dVar21 * dVar26 * dVar19 * dVar19 * dVar19;
        auVar25 = divpd(auVar25,_DAT_0010e170);
        uVar11 = uVar1;
        if (dVar19 != dVar3) {
          uVar11 = uVar13;
        }
        if (NAN(dVar19) || NAN(dVar3)) {
          uVar11 = uVar13;
        }
        uVar13 = uVar16 + 1;
        if (dVar19 != dVar20) {
          uVar13 = uVar16;
        }
        if (!NAN(dVar19) && !NAN(dVar20)) {
          uVar16 = uVar13;
        }
        dVar17 = dVar17 + ((dVar23 * dVar19 + dVar22 * dVar19 * dVar19 * 0.5 + auVar25._8_8_) -
                          (dVar23 * dVar18 + dVar22 * dVar18 * dVar18 * 0.5 + auVar25._0_8_));
        if (dVar19 != dVar20) {
          uVar11 = uVar1;
        }
        uVar13 = uVar11;
        if (NAN(dVar19) || NAN(dVar20)) {
          uVar13 = uVar1;
        }
        if ((uVar12 <= uVar16 + 1) || (uVar14 <= uVar13 + 1)) break;
        dVar20 = *(double *)(lVar7 + (uVar16 + 1) * 0x10);
        dVar22 = *(double *)(lVar8 + (uVar13 + 1) * 0x10);
        dVar18 = dVar19;
        if (dVar22 <= dVar20) {
          dVar20 = dVar22;
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

double compute_inner_product(const Persistence_landscape& l1, const Persistence_landscape& l2) {
  bool dbg = false;
  double result = 0;

  for (size_t level = 0; level != std::min(l1.size(), l2.size()); ++level) {
    if (dbg) {
      std::clog << "Computing inner product for a level : " << level << std::endl;
      getchar();
    }
    auto&& l1_land_level = l1.land[level];
    auto&& l2_land_level = l2.land[level];

    if (l1_land_level.size() * l2_land_level.size() == 0) continue;

    // endpoints of the interval on which we will compute the inner product of two locally linear functions:
    double x1 = -std::numeric_limits<int>::max();
    double x2;
    if (l1_land_level[1].first < l2_land_level[1].first) {
      x2 = l1_land_level[1].first;
    } else {
      x2 = l2_land_level[1].first;
    }

    // iterators for the landscapes l1 and l2
    size_t l1It = 0;
    size_t l2It = 0;

    while ((l1It < l1_land_level.size() - 1) && (l2It < l2_land_level.size() - 1)) {
      // compute the value of a inner product on a interval [x1,x2]

      double a, b, c, d;

      if (l1_land_level[l1It + 1].first != l1_land_level[l1It].first) {
        a = (l1_land_level[l1It + 1].second - l1_land_level[l1It].second) /
            (l1_land_level[l1It + 1].first - l1_land_level[l1It].first);
      } else {
        a = 0;
      }
      b = l1_land_level[l1It].second - a * l1_land_level[l1It].first;
      if (l2_land_level[l2It + 1].first != l2_land_level[l2It].first) {
        c = (l2_land_level[l2It + 1].second - l2_land_level[l2It].second) /
            (l2_land_level[l2It + 1].first - l2_land_level[l2It].first);
      } else {
        c = 0;
      }
      d = l2_land_level[l2It].second - c * l2_land_level[l2It].first;

      double contributionFromThisPart = (a * c * x2 * x2 * x2 / 3 + (a * d + b * c) * x2 * x2 / 2 + b * d * x2) -
                                        (a * c * x1 * x1 * x1 / 3 + (a * d + b * c) * x1 * x1 / 2 + b * d * x1);

      result += contributionFromThisPart;

      if (dbg) {
        std::clog << "[l1_land_level[l1It].first,l1_land_level[l1It+1].first] : " << l1_land_level[l1It].first
                  << " , " << l1_land_level[l1It + 1].first << std::endl;
        std::clog << "[l2_land_level[l2It].first,l2_land_level[l2It+1].first] : " << l2_land_level[l2It].first
                  << " , " << l2_land_level[l2It + 1].first << std::endl;
        std::clog << "a : " << a << ", b : " << b << " , c: " << c << ", d : " << d << std::endl;
        std::clog << "x1 : " << x1 << " , x2 : " << x2 << std::endl;
        std::clog << "contributionFromThisPart : " << contributionFromThisPart << std::endl;
        std::clog << "result : " << result << std::endl;
        getchar();
      }

      // we have two intervals in which functions are constant:
      // [l1_land_level[l1It].first , l1_land_level[l1It+1].first]
      // and
      // [l2_land_level[l2It].first , l2_land_level[l2It+1].first]
      // We also have an interval [x1,x2]. Since the intervals in the landscapes cover the whole R, then it is clear
      // that x2
      // is either l1_land_level[l1It+1].first of l2_land_level[l2It+1].first or both. Lets test it.
      if (x2 == l1_land_level[l1It + 1].first) {
        if (x2 == l2_land_level[l2It + 1].first) {
          // in this case, we increment both:
          ++l2It;
          if (dbg) {
            std::clog << "Incrementing both \n";
          }
        } else {
          if (dbg) {
            std::clog << "Incrementing first \n";
          }
        }
        ++l1It;
      } else {
        // in this case we increment l2It
        ++l2It;
        if (dbg) {
          std::clog << "Incrementing second \n";
        }
      }

      if ( l1It + 1 >= l1_land_level.size()  )break;
      if ( l2It + 1 >= l2_land_level.size()  )break;

      // Now, we shift x1 and x2:
      x1 = x2;
      if (l1_land_level[l1It + 1].first < l2_land_level[l2It + 1].first) {
        x2 = l1_land_level[l1It + 1].first;
      } else {
        x2 = l2_land_level[l2It + 1].first;
      }
    }
  }
  return result;
}